

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O0

bool Control::applyPressureControls(Network *network)

{
  double dVar1;
  Control *this;
  bool bVar2;
  reference ppCVar3;
  Control *control;
  iterator __end1;
  iterator __begin1;
  vector<Control_*,_std::allocator<Control_*>_> *__range1;
  bool changed;
  bool makeChange;
  Network *network_local;
  
  __range1._6_1_ = false;
  __end1 = std::vector<Control_*,_std::allocator<Control_*>_>::begin(&network->controls);
  control = (Control *)std::vector<Control_*,_std::allocator<Control_*>_>::end(&network->controls);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Control_**,_std::vector<Control_*,_std::allocator<Control_*>_>_>
                                     *)&control), bVar2) {
    ppCVar3 = __gnu_cxx::
              __normal_iterator<Control_**,_std::vector<Control_*,_std::allocator<Control_*>_>_>::
              operator*(&__end1);
    this = *ppCVar3;
    if (((*(int *)&(this->super_Element).field_0x2c == 1) &&
        (((this->levelType == LOW_LEVEL && (this->node->head < this->head)) ||
         ((this->levelType == HI_LEVEL &&
          (dVar1 = this->node->head, this->head <= dVar1 && dVar1 != this->head)))))) &&
       (bVar2 = activate(this,true,(ostream *)&network->msgLog), bVar2)) {
      __range1._6_1_ = true;
    }
    __gnu_cxx::__normal_iterator<Control_**,_std::vector<Control_*,_std::allocator<Control_*>_>_>::
    operator++(&__end1);
  }
  return __range1._6_1_;
}

Assistant:

bool Control::applyPressureControls(Network* network)
{
    bool makeChange = true;
    bool changed = false;

    for (Control* control : network->controls)
    {
        if ( control->type == PRESSURE_LEVEL )
        {
            if ( (control->levelType == LOW_LEVEL &&
                  control->node->head < control->head)
            ||   (control->levelType == HI_LEVEL &&
                  control->node->head > control->head) )
            {
                if (control->activate(makeChange, network->msgLog))
                    changed = true;
            }
        }
    }

    return changed;
}